

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((this->comments_ == (CommentInfo *)0x0) ||
     (__s = this->comments_[placement].comment_, __s == (char *)0x0)) {
    __s = "";
    __a = &local_a;
  }
  else {
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}